

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall QMetaEnumBuilderPrivate::~QMetaEnumBuilderPrivate(QMetaEnumBuilderPrivate *this)

{
  QArrayDataPointer<unsigned_long_long>::~QArrayDataPointer(&(this->values).d);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(this->keys).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->enumName).d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

QMetaEnumBuilderPrivate(const QByteArray &_name)
        : name(_name), enumName(_name)
    {
    }